

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_request.c
# Opt level: O2

void ngx_http_process_request_headers(ngx_event_t *rev)

{
  undefined8 *puVar1;
  ngx_http_request_t *r;
  void *pvVar2;
  u_char *puVar3;
  size_t n;
  ngx_int_t nVar4;
  ulong uVar5;
  ngx_uint_t *pnVar6;
  u_char *puVar7;
  void *pvVar8;
  long lVar9;
  char *fmt;
  ngx_log_t *pnVar10;
  ngx_uint_t level;
  ngx_uint_t *pnVar11;
  
  puVar1 = (undefined8 *)rev->data;
  r = (ngx_http_request_t *)*puVar1;
  if ((rev->log->log_level & 0x100) != 0) {
    ngx_log_error_core(8,rev->log,0,"http process request header line");
  }
  if ((rev->field_0x9 & 4) != 0) {
    if (6 < ((ngx_log_t *)puVar1[10])->log_level) {
      ngx_log_error_core(7,(ngx_log_t *)puVar1[10],0x6e,"client timed out");
    }
    *(byte *)((long)puVar1 + 0xd9) = *(byte *)((long)puVar1 + 0xd9) | 8;
    nVar4 = 0x198;
LAB_0013fe8e:
    ngx_http_close_request(r,nVar4);
    return;
  }
  pvVar2 = r->main_conf[ngx_http_core_module.ctx_index];
  do {
    if (r->header_in->pos == r->header_in->end) {
      nVar4 = ngx_http_alloc_large_header_buffer(r,0);
      if (nVar4 == -5) {
        r->field_0x469 = r->field_0x469 | 8;
        pnVar10 = (ngx_log_t *)puVar1[10];
        if (r->header_name_start == (u_char *)0x0) {
          if (6 < pnVar10->log_level) {
            ngx_log_error_core(7,pnVar10,0,"client sent too large request");
          }
        }
        else if (6 < pnVar10->log_level) {
          uVar5 = (long)r->header_in->end - (long)r->header_name_start;
          if (0x6d3 < uVar5) {
            uVar5 = 0x6d4;
          }
          ngx_log_error_core(7,pnVar10,0,"client sent too long header line: \"%*s...\"",uVar5);
        }
        nVar4 = 0x1ee;
        goto LAB_0013fec6;
      }
      if (nVar4 == -1) {
LAB_0013fe89:
        nVar4 = 500;
        goto LAB_0013fe8e;
      }
    }
    uVar5 = ngx_http_read_request_header(r);
    if (0xfffffffffffffffd < uVar5) {
      return;
    }
LAB_0013fc50:
    while( true ) {
      pvVar8 = r->srv_conf[ngx_http_core_module.ctx_index];
      nVar4 = ngx_http_parse_header_line(r,r->header_in,*(ngx_uint_t *)((long)pvVar8 + 0x80));
      if (nVar4 != 0) break;
      pnVar6 = (ngx_uint_t *)r->header_name_start;
      r->request_length = (off_t)(r->header_in->pos + (r->request_length - (long)pnVar6));
      if (((r->field_0x465 & 2) == 0) || (*(long *)((long)pvVar8 + 0x70) == 0)) {
        pnVar6 = (ngx_uint_t *)ngx_list_push(&(r->headers_in).headers);
        if (pnVar6 != (ngx_uint_t *)0x0) {
          *pnVar6 = r->header_hash;
          puVar7 = r->header_name_start;
          puVar3 = r->header_name_end;
          pnVar6[1] = (long)puVar3 - (long)puVar7;
          pnVar6[2] = (ngx_uint_t)puVar7;
          *puVar3 = '\0';
          puVar7 = r->header_start;
          puVar3 = r->header_end;
          pnVar6[3] = (long)puVar3 - (long)puVar7;
          pnVar6[4] = (ngx_uint_t)puVar7;
          *puVar3 = '\0';
          puVar7 = (u_char *)ngx_pnalloc(r->pool,pnVar6[1]);
          pnVar6[5] = (ngx_uint_t)puVar7;
          if (puVar7 != (u_char *)0x0) goto code_r0x0013fd47;
        }
        goto LAB_0013fe89;
      }
      pnVar10 = (ngx_log_t *)puVar1[10];
      if (6 < pnVar10->log_level) {
        pnVar11 = (ngx_uint_t *)(r->header_end + -(long)pnVar6);
        level = 7;
        fmt = "client sent invalid header line: \"%*s\"";
        goto LAB_0013fdc9;
      }
    }
  } while (nVar4 == -2);
  if (nVar4 == 1) {
    pnVar10 = r->connection->log;
    if ((pnVar10->log_level & 0x100) != 0) {
      ngx_log_error_core(8,pnVar10,0,"http header done");
    }
    r->request_length =
         (off_t)(r->header_in->pos + (r->request_length - (long)r->header_name_start));
    *(ulong *)&r->field_0x460 = *(ulong *)&r->field_0x460 & 0xffffffe1ffffffff | 0x400000000;
    nVar4 = ngx_http_process_request_header(r);
    if (nVar4 != 0) {
      return;
    }
    ngx_http_process_request(r);
    return;
  }
  if (6 < ((ngx_log_t *)puVar1[10])->log_level) {
    ngx_log_error_core(7,(ngx_log_t *)puVar1[10],0,"client sent invalid header line");
  }
  nVar4 = 400;
LAB_0013fec6:
  ngx_http_finalize_request(r,nVar4);
  return;
code_r0x0013fd47:
  pnVar11 = pnVar6 + 1;
  n = *pnVar11;
  if (n == r->lowcase_index) {
    memcpy(puVar7,r->lowcase_header,n);
  }
  else {
    ngx_strlow(puVar7,(u_char *)pnVar6[2],n);
  }
  pvVar8 = ngx_hash_find((ngx_hash_t *)((long)pvVar2 + 0x40),*pnVar6,(u_char *)pnVar6[5],pnVar6[1]);
  if ((pvVar8 != (void *)0x0) &&
     (lVar9 = (**(code **)((long)pvVar8 + 0x18))(r,pnVar6,*(undefined8 *)((long)pvVar8 + 0x10)),
     lVar9 != 0)) {
    return;
  }
  pnVar10 = r->connection->log;
  if ((pnVar10->log_level & 0x100) != 0) {
    pnVar6 = pnVar6 + 3;
    level = 8;
    fmt = "http header: \"%V: %V\"";
LAB_0013fdc9:
    ngx_log_error_core(level,pnVar10,0,fmt,pnVar11,pnVar6);
  }
  goto LAB_0013fc50;
}

Assistant:

static void
ngx_http_process_request_headers(ngx_event_t *rev)
{
    u_char                     *p;
    size_t                      len;
    ssize_t                     n;
    ngx_int_t                   rc, rv;
    ngx_table_elt_t            *h;
    ngx_connection_t           *c;
    ngx_http_header_t          *hh;
    ngx_http_request_t         *r;
    ngx_http_core_srv_conf_t   *cscf;
    ngx_http_core_main_conf_t  *cmcf;

    c = rev->data;
    r = c->data;

    ngx_log_debug0(NGX_LOG_DEBUG_HTTP, rev->log, 0,
                   "http process request header line");

    if (rev->timedout) {
        ngx_log_error(NGX_LOG_INFO, c->log, NGX_ETIMEDOUT, "client timed out");
        c->timedout = 1;
        ngx_http_close_request(r, NGX_HTTP_REQUEST_TIME_OUT);
        return;
    }

    cmcf = ngx_http_get_module_main_conf(r, ngx_http_core_module);

    rc = NGX_AGAIN;

    for ( ;; ) {

        if (rc == NGX_AGAIN) {

            if (r->header_in->pos == r->header_in->end) {

                rv = ngx_http_alloc_large_header_buffer(r, 0);

                if (rv == NGX_ERROR) {
                    ngx_http_close_request(r, NGX_HTTP_INTERNAL_SERVER_ERROR);
                    return;
                }

                if (rv == NGX_DECLINED) {
                    p = r->header_name_start;

                    r->lingering_close = 1;

                    if (p == NULL) {
                        ngx_log_error(NGX_LOG_INFO, c->log, 0,
                                      "client sent too large request");
                        ngx_http_finalize_request(r,
                                            NGX_HTTP_REQUEST_HEADER_TOO_LARGE);
                        return;
                    }

                    len = r->header_in->end - p;

                    if (len > NGX_MAX_ERROR_STR - 300) {
                        len = NGX_MAX_ERROR_STR - 300;
                    }

                    ngx_log_error(NGX_LOG_INFO, c->log, 0,
                                "client sent too long header line: \"%*s...\"",
                                len, r->header_name_start);

                    ngx_http_finalize_request(r,
                                            NGX_HTTP_REQUEST_HEADER_TOO_LARGE);
                    return;
                }
            }

            n = ngx_http_read_request_header(r);

            if (n == NGX_AGAIN || n == NGX_ERROR) {
                return;
            }
        }

        /* the host header could change the server configuration context */
        cscf = ngx_http_get_module_srv_conf(r, ngx_http_core_module);

        rc = ngx_http_parse_header_line(r, r->header_in,
                                        cscf->underscores_in_headers);

        if (rc == NGX_OK) {

            r->request_length += r->header_in->pos - r->header_name_start;

            if (r->invalid_header && cscf->ignore_invalid_headers) {

                /* there was error while a header line parsing */

                ngx_log_error(NGX_LOG_INFO, c->log, 0,
                              "client sent invalid header line: \"%*s\"",
                              r->header_end - r->header_name_start,
                              r->header_name_start);
                continue;
            }

            /* a header line has been parsed successfully */

            h = ngx_list_push(&r->headers_in.headers);
            if (h == NULL) {
                ngx_http_close_request(r, NGX_HTTP_INTERNAL_SERVER_ERROR);
                return;
            }

            h->hash = r->header_hash;

            h->key.len = r->header_name_end - r->header_name_start;
            h->key.data = r->header_name_start;
            h->key.data[h->key.len] = '\0';

            h->value.len = r->header_end - r->header_start;
            h->value.data = r->header_start;
            h->value.data[h->value.len] = '\0';

            h->lowcase_key = ngx_pnalloc(r->pool, h->key.len);
            if (h->lowcase_key == NULL) {
                ngx_http_close_request(r, NGX_HTTP_INTERNAL_SERVER_ERROR);
                return;
            }

            if (h->key.len == r->lowcase_index) {
                ngx_memcpy(h->lowcase_key, r->lowcase_header, h->key.len);

            } else {
                ngx_strlow(h->lowcase_key, h->key.data, h->key.len);
            }

            hh = ngx_hash_find(&cmcf->headers_in_hash, h->hash,
                               h->lowcase_key, h->key.len);

            if (hh && hh->handler(r, h, hh->offset) != NGX_OK) {
                return;
            }

            ngx_log_debug2(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                           "http header: \"%V: %V\"",
                           &h->key, &h->value);

            continue;
        }

        if (rc == NGX_HTTP_PARSE_HEADER_DONE) {

            /* a whole header has been parsed successfully */

            ngx_log_debug0(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                           "http header done");

            r->request_length += r->header_in->pos - r->header_name_start;

            r->http_state = NGX_HTTP_PROCESS_REQUEST_STATE;

            rc = ngx_http_process_request_header(r);

            if (rc != NGX_OK) {
                return;
            }

            ngx_http_process_request(r);

            return;
        }

        if (rc == NGX_AGAIN) {

            /* a header line parsing is still not complete */

            continue;
        }

        /* rc == NGX_HTTP_PARSE_INVALID_HEADER */

        ngx_log_error(NGX_LOG_INFO, c->log, 0,
                      "client sent invalid header line");

        ngx_http_finalize_request(r, NGX_HTTP_BAD_REQUEST);
        return;
    }
}